

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O1

void __thiscall lsim::StringProperty::value(StringProperty *this,int64_t val)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint __len;
  ulong __val;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  __val = -val;
  if (0 < val) {
    __val = val;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00110bb8;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00110bb8;
      }
      if (uVar3 < 10000) goto LAB_00110bb8;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00110bb8:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(val >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_50[0] - (val >> 0x3f)),__len,__val);
  std::__cxx11::string::operator=((string *)&this->m_value,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void StringProperty::value(int64_t val) {
    m_value = std::to_string(val);   
}